

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZCompEl_*,_10>::TPZManVector(TPZManVector<TPZCompEl_*,_10> *this,int64_t size)

{
  TPZCompEl **ppTVar1;
  int64_t iVar2;
  
  TPZVec<TPZCompEl_*>::TPZVec(&this->super_TPZVec<TPZCompEl_*>,0);
  (this->super_TPZVec<TPZCompEl_*>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0181a9a8;
  if (size < 0xb) {
    ppTVar1 = this->fExtAlloc;
    iVar2 = 0;
  }
  else {
    ppTVar1 = (TPZCompEl **)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
    iVar2 = size;
  }
  (this->super_TPZVec<TPZCompEl_*>).fStore = ppTVar1;
  (this->super_TPZVec<TPZCompEl_*>).fNElements = size;
  (this->super_TPZVec<TPZCompEl_*>).fNAlloc = iVar2;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}